

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSInputImpl.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DOMLSInputImpl::setEncoding(DOMLSInputImpl *this,XMLCh *encodingStr)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n;
  XMLCh *__dest;
  
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncoding);
  if (encodingStr == (XMLCh *)0x0) {
    __dest = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)encodingStr + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar2);
    memcpy(__dest,encodingStr,__n);
  }
  this->fEncoding = __dest;
  return;
}

Assistant:

void DOMLSInputImpl::setEncoding(const XMLCh* const encodingStr)
{
    fMemoryManager->deallocate(fEncoding);
    fEncoding = XMLString::replicate(encodingStr, fMemoryManager);
}